

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O1

void flux_test::copyTest(void)

{
  SystemImpl *this;
  SystemImpl *this_00;
  FlowImpl *this_01;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  this_01 = (FlowImpl *)operator_new(0x38);
  FlowImpl::FlowImpl(this_01,(System *)this,(System *)this_00);
  *(undefined ***)this_01 = &PTR_execute_00106cb0;
  return;
}

Assistant:

void flux_test::copyTest() {
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *flux1 = new FlowExp(s1, s2);
    auto *flux2 = flux1;
    assert(flux1 == flux2);
}